

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

void sysbvm_primitiveTable_registerFunction
               (sysbvm_functionEntryPoint_t primitiveEntryPoint,char *primitiveName)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)sysbvm_primitiveTableSize;
  lVar3 = 0;
  do {
    if (uVar2 * 0x10 + 0x10 == lVar3 + 0x10) {
      if (0x3ff < sysbvm_primitiveTableSize) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:42: assertion failure: sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY"
                  );
        uVar2 = (ulong)sysbvm_primitiveTableSize;
      }
      sysbvm_primitiveTable[uVar2].entryPoint = primitiveEntryPoint;
      sysbvm_primitiveTable[uVar2].name = primitiveName;
      sysbvm_primitiveTableSize = sysbvm_primitiveTableSize + 1;
      return;
    }
    plVar1 = (long *)((long)&sysbvm_primitiveTable[0].entryPoint + lVar3);
    lVar3 = lVar3 + 0x10;
  } while ((sysbvm_functionEntryPoint_t)*plVar1 != primitiveEntryPoint);
  return;
}

Assistant:

void sysbvm_primitiveTable_registerFunction(sysbvm_functionEntryPoint_t primitiveEntryPoint, const char *primitiveName)
{
    for(size_t i = 0; i < sysbvm_primitiveTableSize; ++i)
    {
        if(sysbvm_primitiveTable[i].entryPoint == primitiveEntryPoint)
            return;
    }

    SYSBVM_ASSERT(sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY);
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].entryPoint = primitiveEntryPoint;
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].name = primitiveName;
    ++sysbvm_primitiveTableSize;
}